

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Statement * __thiscall Parser::simpStmt(Parser *this)

{
  bool bVar1;
  ExprNode *id;
  AssignmentStatement *unaff_R15;
  Token tok;
  Token op;
  Token TStack_f8;
  Token local_88;
  
  Tokenizer::getToken(&TStack_f8,this->tokenizer);
  Tokenizer::ungetToken(this->tokenizer);
  bVar1 = Token::isPrint(&TStack_f8);
  if (bVar1) {
    Tokenizer::ungetToken(this->tokenizer);
    unaff_R15 = (AssignmentStatement *)printStmt(this);
  }
  else {
    bVar1 = Token::isReturn(&TStack_f8);
    if (bVar1) {
      unaff_R15 = (AssignmentStatement *)returnStmt(this);
    }
    else if (TStack_f8._name._M_string_length == 0) {
      unaff_R15 = (AssignmentStatement *)0x0;
    }
    else {
      id = variableID(this);
      Tokenizer::getToken(&local_88,this->tokenizer);
      Tokenizer::ungetToken(this->tokenizer);
      if (local_88._symbol == '(') {
        unaff_R15 = (AssignmentStatement *)callStmt(this,id);
      }
      else if (local_88._symbol == '.') {
        unaff_R15 = (AssignmentStatement *)arrayOps(this,id);
      }
      else if ((local_88._symbol == '[') || (local_88._symbol == '=')) {
        unaff_R15 = assignStmt(this,id);
      }
      Token::~Token(&local_88);
    }
  }
  Token::~Token(&TStack_f8);
  return (Statement *)unaff_R15;
}

Assistant:

Statement *Parser::simpStmt() {
    // stimple_stmt: (print_stmt | assign_stmt | array_ops | call_stmt | return_stmt) NEWLINE

    Token tok = tokenizer.getToken();
    tokenizer.ungetToken();
    if (tok.isPrint()){
        tokenizer.ungetToken();
        PrintStatement *printStatement = printStmt();
        return printStatement;
    } else if (tok.isReturn()){
        ReturnStatement *returnStatement = returnStmt();
        return returnStatement;
    }else if(tok.isName()) {
        ExprNode *id = variableID();
        Token op = tokenizer.getToken();
        tokenizer.ungetToken();
        if(op.isAssignmentOperator() || op.isOpenBrace()) {
            AssignmentStatement *assignmentStatement = assignStmt(id);
            return assignmentStatement;
        } else if(op.isDot()){
            ArrayOps *arrayOperator = arrayOps(id);
            return arrayOperator;
        } else if(op.isOpenParen()){
            CallStatement *callStatement = callStmt(id);
            return callStatement;
        }

    } else return nullptr;


}